

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v6::internal::fallback_format<long_double>(longdouble d,buffer<char> *buf,int *exp10)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bigint *lhs2;
  char *pcVar4;
  int *in_RSI;
  buffer<char> *in_RDI;
  unkbyte10 in_stack_00000008;
  int result;
  bool high;
  bool low;
  int digit;
  char *data;
  int num_digits;
  bool even;
  uint64_t significand;
  int shift;
  fp value;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 uVar5;
  int exp;
  undefined2 uVar6;
  undefined6 in_stack_fffffffffffffcc2;
  uint64_t in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  undefined2 in_stack_fffffffffffffcd8;
  undefined2 in_stack_fffffffffffffcda;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 uVar7;
  int in_stack_fffffffffffffce4;
  undefined2 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcea;
  byte in_stack_fffffffffffffceb;
  int in_stack_fffffffffffffcec;
  int iVar8;
  undefined4 in_stack_fffffffffffffcfc;
  uint uVar9;
  undefined4 in_stack_fffffffffffffd08;
  fp local_2f0;
  undefined1 *local_2e0;
  undefined1 local_2d8 [168];
  undefined1 local_230 [520];
  int *local_28;
  buffer<char> *local_20;
  unkbyte10 local_18;
  
  local_18 = in_stack_00000008;
  local_28 = in_RSI;
  local_20 = in_RDI;
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  local_2e0 = (undefined1 *)0x0;
  fp::fp(&local_2f0);
  uVar5 = (undefined4)local_18;
  exp = (int)((unkuint10)local_18 >> 0x20);
  uVar6 = (undefined2)((unkuint10)local_18 >> 0x40);
  bVar1 = fp::assign<long_double,_0>
                    ((fp *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     (longdouble)
                     CONCAT28(in_stack_fffffffffffffcd8,
                              CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0)));
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffce0);
  iVar3 = 1;
  if (bVar1) {
    iVar3 = 2;
  }
  lhs2 = (bigint *)(local_2f0.f << (sbyte)iVar3);
  if (local_2f0.e < 0) {
    if (*local_28 < 0) {
      bigint::assign_pow10((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),exp);
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,uVar7),
                     (bigint *)
                     CONCAT44(in_stack_fffffffffffffcdc,
                              CONCAT22(in_stack_fffffffffffffcda,in_stack_fffffffffffffcd8)));
      if (iVar3 != 1) {
        bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffce4,uVar7),
                       (bigint *)
                       CONCAT44(in_stack_fffffffffffffcdc,
                                CONCAT22(in_stack_fffffffffffffcda,in_stack_fffffffffffffcd8)));
        bigint::operator<<=((bigint *)
                            CONCAT44(in_stack_fffffffffffffcec,
                                     CONCAT13(in_stack_fffffffffffffceb,
                                              CONCAT12(in_stack_fffffffffffffcea,
                                                       in_stack_fffffffffffffce8))),
                            in_stack_fffffffffffffce4);
        local_2e0 = local_2d8;
      }
      bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),CONCAT44(exp,uVar5));
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
      bigint::operator<<=((bigint *)
                          CONCAT44(in_stack_fffffffffffffcec,
                                   CONCAT13(in_stack_fffffffffffffceb,
                                            CONCAT12(in_stack_fffffffffffffcea,
                                                     in_stack_fffffffffffffce8))),
                          in_stack_fffffffffffffce4);
    }
    else {
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
      bigint::assign_pow10((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),exp);
      bigint::operator<<=((bigint *)
                          CONCAT44(in_stack_fffffffffffffcec,
                                   CONCAT13(in_stack_fffffffffffffceb,
                                            CONCAT12(in_stack_fffffffffffffcea,
                                                     in_stack_fffffffffffffce8))),
                          in_stack_fffffffffffffce4);
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
      if (iVar3 != 1) {
        bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                       in_stack_fffffffffffffcc8);
        local_2e0 = local_2d8;
      }
    }
  }
  else {
    bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   in_stack_fffffffffffffcc8);
    bigint::operator<<=((bigint *)
                        CONCAT44(in_stack_fffffffffffffcec,
                                 CONCAT13(in_stack_fffffffffffffceb,
                                          CONCAT12(in_stack_fffffffffffffcea,
                                                   in_stack_fffffffffffffce8))),
                        in_stack_fffffffffffffce4);
    bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   in_stack_fffffffffffffcc8);
    bigint::operator<<=((bigint *)
                        CONCAT44(in_stack_fffffffffffffcec,
                                 CONCAT13(in_stack_fffffffffffffceb,
                                          CONCAT12(in_stack_fffffffffffffcea,
                                                   in_stack_fffffffffffffce8))),
                        in_stack_fffffffffffffce4);
    if (iVar3 != 1) {
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
      bigint::operator<<=((bigint *)
                          CONCAT44(in_stack_fffffffffffffcec,
                                   CONCAT13(in_stack_fffffffffffffceb,
                                            CONCAT12(in_stack_fffffffffffffcea,
                                                     in_stack_fffffffffffffce8))),
                          in_stack_fffffffffffffce4);
      local_2e0 = local_2d8;
    }
    bigint::assign_pow10((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),exp);
    bigint::operator<<=((bigint *)
                        CONCAT44(in_stack_fffffffffffffcec,
                                 CONCAT13(in_stack_fffffffffffffceb,
                                          CONCAT12(in_stack_fffffffffffffcea,
                                                   in_stack_fffffffffffffce8))),
                        in_stack_fffffffffffffce4);
  }
  if (local_2e0 == (undefined1 *)0x0) {
    local_2e0 = local_230;
  }
  uVar9 = CONCAT13((local_2f0.f & 1) == 0,(int3)in_stack_fffffffffffffcfc);
  iVar8 = 0;
  pcVar4 = buffer<char>::data(local_20);
  while( true ) {
    in_stack_fffffffffffffcec =
         bigint::divmod_assign
                   ((bigint *)
                    CONCAT44(in_stack_fffffffffffffcec,
                             CONCAT13(in_stack_fffffffffffffceb,
                                      CONCAT12(in_stack_fffffffffffffcea,in_stack_fffffffffffffce8))
                            ),(bigint *)CONCAT44(in_stack_fffffffffffffce4,uVar7));
    iVar2 = compare((bigint *)
                    CONCAT44(in_stack_fffffffffffffcec,
                             CONCAT22(in_stack_fffffffffffffcda,in_stack_fffffffffffffcd8)),
                    (bigint *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    in_stack_fffffffffffffcd8 = (undefined2)iVar2;
    in_stack_fffffffffffffcda = (undefined2)((uint)iVar2 >> 0x10);
    in_stack_fffffffffffffceb = (byte)(iVar2 - (uVar9 >> 0x18 & 1) >> 0x1f);
    in_stack_fffffffffffffcd4 =
         add_compare((bigint *)CONCAT44(iVar3,in_stack_fffffffffffffd08),lhs2,
                     (bigint *)CONCAT44(uVar9,iVar8));
    in_stack_fffffffffffffcea =
         0 < (int)(in_stack_fffffffffffffcd4 + (uint)((byte)(uVar9 >> 0x18) & 1));
    iVar2 = iVar8 + 1;
    pcVar4[iVar8] = (char)in_stack_fffffffffffffcec + '0';
    if (((in_stack_fffffffffffffceb & 1) != 0) || ((bool)in_stack_fffffffffffffcea)) break;
    bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),exp);
    bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),exp);
    iVar8 = iVar2;
    if (local_2e0 != local_230) {
      bigint::operator*=((bigint *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),exp);
      iVar8 = iVar2;
    }
  }
  if ((in_stack_fffffffffffffceb & 1) == 0) {
    pcVar4[iVar8] = pcVar4[iVar8] + '\x01';
  }
  else if (((bool)in_stack_fffffffffffffcea) &&
          ((iVar3 = add_compare((bigint *)CONCAT44(iVar3,in_stack_fffffffffffffd08),lhs2,
                                (bigint *)CONCAT44(uVar9,iVar2)), 0 < iVar3 ||
           ((iVar3 == 0 && (in_stack_fffffffffffffcec % 2 != 0)))))) {
    pcVar4[iVar2 + -1] = pcVar4[iVar2 + -1] + '\x01';
  }
  to_unsigned<int>(iVar2);
  buffer<char>::resize
            ((buffer<char> *)CONCAT62(in_stack_fffffffffffffcc2,uVar6),CONCAT44(exp,uVar5));
  *local_28 = *local_28 - (iVar2 + -1);
  bigint::~bigint((bigint *)0x1f258a);
  bigint::~bigint((bigint *)0x1f2597);
  bigint::~bigint((bigint *)0x1f25a4);
  bigint::~bigint((bigint *)0x1f25b1);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}